

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Tracks::~Tracks(Tracks *this)

{
  uint uVar1;
  Track **ppTVar2;
  ulong uVar3;
  
  ppTVar2 = this->track_entries_;
  if (ppTVar2 == (Track **)0x0) {
    return;
  }
  uVar1 = this->track_entries_size_;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      if (this->track_entries_[uVar3] != (Track *)0x0) {
        (*this->track_entries_[uVar3]->_vptr_Track[1])();
        uVar1 = this->track_entries_size_;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar1);
    ppTVar2 = this->track_entries_;
    if (ppTVar2 == (Track **)0x0) {
      return;
    }
  }
  operator_delete__(ppTVar2);
  return;
}

Assistant:

Tracks::~Tracks() {
  if (track_entries_) {
    for (uint32_t i = 0; i < track_entries_size_; ++i) {
      Track* const track = track_entries_[i];
      delete track;
    }
    delete[] track_entries_;
  }
}